

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoMode.cpp
# Opt level: O2

bool sf::operator<(VideoMode *left,VideoMode *right)

{
  bool bVar1;
  
  bVar1 = left->bitsPerPixel < right->bitsPerPixel;
  if ((left->bitsPerPixel == right->bitsPerPixel) &&
     (bVar1 = left->width < right->width, left->width == right->width)) {
    bVar1 = left->height < right->height;
  }
  return bVar1;
}

Assistant:

bool operator <(const VideoMode& left, const VideoMode& right)
{
    if (left.bitsPerPixel == right.bitsPerPixel)
    {
        if (left.width == right.width)
        {
            return left.height < right.height;
        }
        else
        {
            return left.width < right.width;
        }
    }
    else
    {
        return left.bitsPerPixel < right.bitsPerPixel;
    }
}